

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMAttrNSImpl::DOMAttrNSImpl
          (DOMAttrNSImpl *this,DOMDocument *ownerDoc,XMLCh *namespaceURI,XMLCh *prefix,
          XMLCh *localName,XMLCh *qualifiedName)

{
  DOMDocument *pDVar1;
  XMLCh *pXVar2;
  XMLCh *namespaceURI_00;
  DOMDocumentImpl *this_00;
  
  DOMAttrImpl::DOMAttrImpl(&this->super_DOMAttrImpl,ownerDoc,qualifiedName);
  (this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMAttrImpl_003fbab8;
  (this->super_DOMAttrImpl).super_HasDOMNodeImpl._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMAttrNSImpl_003fbc90;
  (this->super_DOMAttrImpl).super_HasDOMParentImpl._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMAttrNSImpl_003fbcc0;
  pDVar1 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
  this_00 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  if (pDVar1 == (DOMDocument *)0x0) {
    this_00 = (DOMDocumentImpl *)0x0;
  }
  if ((prefix == (XMLCh *)0x0) || (*prefix == L'\0')) {
    this->fPrefix = (XMLCh *)0x0;
    this->fLocalName = (this->super_DOMAttrImpl).fName;
    pXVar2 = (XMLCh *)0x0;
  }
  else {
    pXVar2 = DOMDocumentImpl::getPooledString(this_00,prefix);
    this->fPrefix = pXVar2;
    pXVar2 = DOMDocumentImpl::getPooledString(this_00,localName);
    this->fLocalName = pXVar2;
    pXVar2 = this->fPrefix;
  }
  namespaceURI_00 = (XMLCh *)0x0;
  if ((namespaceURI != (XMLCh *)0x0) && (*namespaceURI != L'\0')) {
    namespaceURI_00 = namespaceURI;
  }
  pXVar2 = DOMNodeImpl::mapPrefix(pXVar2,namespaceURI_00,2);
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar2 = (XMLCh *)0x0;
  }
  else {
    pXVar2 = DOMDocumentImpl::getPooledString(this_00,pXVar2);
  }
  this->fNamespaceURI = pXVar2;
  return;
}

Assistant:

DOMAttrNSImpl::
DOMAttrNSImpl(DOMDocument *ownerDoc,
              const XMLCh *namespaceURI,
              const XMLCh *prefix,
              const XMLCh *localName,
              const XMLCh *qualifiedName)
    : DOMAttrImpl(ownerDoc, qualifiedName)
{
  DOMDocumentImpl* docImpl = (DOMDocumentImpl*)fParent.fOwnerDocument;

  if (prefix == 0 || *prefix == 0)
  {
    fPrefix = 0;
    fLocalName = fName;
  }
  else
  {
    fPrefix = docImpl->getPooledString(prefix);
    fLocalName = docImpl->getPooledString(localName);
  }

  // DOM Level 3: namespace URI is never empty string.
  //
  const XMLCh * URI = DOMNodeImpl::mapPrefix
    (
      fPrefix,
      (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
      DOMNode::ATTRIBUTE_NODE
    );
  this -> fNamespaceURI = (URI == 0) ? 0 : docImpl->getPooledString(URI);
}